

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void getFileNames(string *path,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *files)

{
  pointer pcVar1;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  long *plVar4;
  ostream *poVar5;
  size_type *psVar6;
  char *__s;
  string filename;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar2 = readdir(__dirp);
    if (pdVar2 != (dirent *)0x0) {
      do {
        if ((pdVar2->d_name[0] != '.') ||
           ((pdVar2->d_name[1] != '\0' &&
            ((pdVar2->d_name[1] != '.' || (pdVar2->d_name[2] != '\0')))))) {
          __s = pdVar2->d_name;
          local_70[0] = local_60;
          sVar3 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70,__s,__s + sVar3);
          local_90[0] = local_80;
          pcVar1 = (path->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar1,pcVar1 + path->_M_string_length);
          std::__cxx11::string::append((char *)local_90);
          plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_90,(ulong)local_70[0]);
          psVar6 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_50.field_2._M_allocated_capacity = *psVar6;
            local_50.field_2._8_8_ = plVar4[3];
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = *psVar6;
            local_50._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_50._M_string_length = plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                     &local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
        }
        pdVar2 = readdir(__dirp);
      } while (pdVar2 != (dirent *)0x0);
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Folder doesn\'t Exist!");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(-1);
}

Assistant:

void getFileNames(std::string path, std::vector<std::string>& files)
{
	DIR* pDir;
	struct dirent* ptr;
	if (!(pDir = opendir(path.c_str()))) {
		std::cout << "Folder doesn't Exist!" << std::endl;
		exit(-1);
	}
	while ((ptr = readdir(pDir)) != 0) {
		if (strcmp(ptr->d_name, ".") != 0 && strcmp(ptr->d_name, "..") != 0) {
			std::string filename(ptr->d_name);
			files.push_back(path + "/" + filename);
		}
	}
}